

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

void __thiscall ymfm::ym2203::write_data(ym2203 *this,uint8_t data)

{
  byte bVar1;
  ymfm_interface *pyVar2;
  size_t in_RCX;
  
  bVar1 = this->m_address;
  if (bVar1 < 0x10) {
    ssg_engine::write(&this->m_ssg,(uint)bVar1,(void *)(ulong)data,in_RCX);
  }
  else {
    fm_engine_base<ymfm::opn_registers_base<false>_>::write
              (&this->m_fm,(uint)bVar1,(void *)(ulong)data,in_RCX);
  }
  pyVar2 = (this->m_fm).m_intf;
  (*(code *)pyVar2->m_engine[3]._vptr_ymfm_engine_callbacks)
            (pyVar2,(ulong)(this->m_fm).m_clock_prescale << 5);
  return;
}

Assistant:

void ym2203::write_data(uint8_t data)
{
	if (m_address < 0x10)
	{
		// 00-0F: write to SSG
		m_ssg.write(m_address & 0x0f, data);
	}
	else
	{
		// 10-FF: write to FM
		m_fm.write(m_address, data);
	}

	// mark busy for a bit
	m_fm.intf().ymfm_set_busy_end(32 * m_fm.clock_prescale());
}